

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void substSelect(SubstContext *pSubst,Select *p,int doPrior)

{
  ExprList *pEVar1;
  bool bVar2;
  Expr *pEVar3;
  long lVar4;
  ExprList_item *pEVar5;
  SrcList_item *pSVar6;
  int iVar7;
  
  if (p != (Select *)0x0) {
    do {
      pEVar1 = p->pEList;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        lVar4 = 0;
        do {
          pEVar3 = substExpr(pSubst,pEVar5->pExpr);
          pEVar5->pExpr = pEVar3;
          lVar4 = lVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (lVar4 < pEVar1->nExpr);
      }
      pEVar1 = p->pGroupBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        lVar4 = 0;
        do {
          pEVar3 = substExpr(pSubst,pEVar5->pExpr);
          pEVar5->pExpr = pEVar3;
          lVar4 = lVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (lVar4 < pEVar1->nExpr);
      }
      pEVar1 = p->pOrderBy;
      if ((pEVar1 != (ExprList *)0x0) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        lVar4 = 0;
        do {
          pEVar3 = substExpr(pSubst,pEVar5->pExpr);
          pEVar5->pExpr = pEVar3;
          lVar4 = lVar4 + 1;
          pEVar5 = pEVar5 + 1;
        } while (lVar4 < pEVar1->nExpr);
      }
      pEVar3 = substExpr(pSubst,p->pHaving);
      p->pHaving = pEVar3;
      pEVar3 = substExpr(pSubst,p->pWhere);
      p->pWhere = pEVar3;
      iVar7 = p->pSrc->nSrc;
      if (0 < iVar7) {
        pSVar6 = p->pSrc->a;
        do {
          substSelect(pSubst,pSVar6->pSelect,1);
          if (((((pSVar6->fg).field_0x1 & 4) != 0) &&
              (pEVar1 = (pSVar6->u1).pFuncArg, pEVar1 != (ExprList *)0x0)) && (0 < pEVar1->nExpr)) {
            pEVar5 = pEVar1->a;
            lVar4 = 0;
            do {
              pEVar3 = substExpr(pSubst,pEVar5->pExpr);
              pEVar5->pExpr = pEVar3;
              lVar4 = lVar4 + 1;
              pEVar5 = pEVar5 + 1;
            } while (lVar4 < pEVar1->nExpr);
          }
          pSVar6 = pSVar6 + 1;
          bVar2 = 1 < iVar7;
          iVar7 = iVar7 + -1;
        } while (bVar2);
      }
    } while ((doPrior != 0) && (p = p->pPrior, p != (Select *)0x0));
  }
  return;
}

Assistant:

static void substSelect(
  SubstContext *pSubst, /* Description of the substitution */
  Select *p,            /* SELECT statement in which to make substitutions */
  int doPrior           /* Do substitutes on p->pPrior too */
){
  SrcList *pSrc;
  struct SrcList_item *pItem;
  int i;
  if( !p ) return;
  do{
    substExprList(pSubst, p->pEList);
    substExprList(pSubst, p->pGroupBy);
    substExprList(pSubst, p->pOrderBy);
    p->pHaving = substExpr(pSubst, p->pHaving);
    p->pWhere = substExpr(pSubst, p->pWhere);
    pSrc = p->pSrc;
    assert( pSrc!=0 );
    for(i=pSrc->nSrc, pItem=pSrc->a; i>0; i--, pItem++){
      substSelect(pSubst, pItem->pSelect, 1);
      if( pItem->fg.isTabFunc ){
        substExprList(pSubst, pItem->u1.pFuncArg);
      }
    }
  }while( doPrior && (p = p->pPrior)!=0 );
}